

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall
ON_OBSOLETE_V5_DimAngular::Read(ON_OBSOLETE_V5_DimAngular *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int minor_version;
  int major_version;
  int local_28 [2];
  
  local_28[0] = 0;
  local_28[1] = 0;
  iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
  if ((iVar3 < 5) || (uVar4 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file), uVar4 < 0xbf69824)) {
    bVar2 = false;
  }
  else {
    bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,local_28 + 1,local_28);
    bVar2 = true;
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = ON_OBSOLETE_V5_Annotation::Read(&this->super_ON_OBSOLETE_V5_Annotation,file);
  if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_angle), bVar1)) {
    bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_radius);
  }
  else {
    bVar1 = false;
  }
  if (bVar2) {
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar1 = (bool)(bVar2 & bVar1);
  }
  return bVar1;
}

Assistant:

bool ON_OBSOLETE_V5_DimAngular::Read( ON_BinaryArchive& file )
{
  // 18 October 2007 Dale Lear
  //    I added the chunk wrapping so V5 and future versions can
  //    add IO support for information specific to ON_OBSOLETE_V5_DimAngular
  int major_version = 0;
  int minor_version = 0;
  bool rc = false;
  bool bInChunk = (file.Archive3dmVersion() >= 5 && file.ArchiveOpenNURBSVersion() >= 200710180);
  if ( bInChunk )
  {
    rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
    if ( !rc )
      return false;
  }
  else
  {
    rc = true;
  }

  while(rc)
  {
    rc = ON_OBSOLETE_V5_Annotation::Read(file)?true:false;
    if (!rc) break;
    rc = file.ReadDouble( &m_angle);
    if (!rc) break;
    rc = file.ReadDouble( &m_radius);
    if (!rc) break;
    if ( !bInChunk || minor_version <= 0 )
      break;

    // Code to read any new ON_OBSOLETE_V5_DimAngular fields will 
    // go here.

    break;
  }

  if ( bInChunk )
  {
    // To read new ON_OBSOLETE_V5_DimAngular specific additions,
    // examine the minor version number and read the information
    // here.  Please ask Dale Lear for help.

    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}